

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu.c
# Opt level: O1

MPP_RET vdpu_av1d_wait(void *hal,HalTaskInfo *task)

{
  long lVar1;
  long lVar2;
  MPP_RET MVar3;
  long *plVar4;
  void *pvVar5;
  DecCbHalDone m_ctx;
  void *local_48;
  void *local_40;
  uint local_38;
  
  if (hal == (void *)0x0) {
    if (((byte)hal_av1d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_av1d_vdpu","input empty(%d).\n",(char *)0x0,0x903);
    }
  }
  else {
    lVar1 = *(long *)((long)hal + 0x50);
    if (*(int *)((long)hal + 0x58) == 0) {
      plVar4 = (long *)(lVar1 + 0x1e7a8);
    }
    else {
      plVar4 = (long *)((long)(task->dec).reg_index * 0x10 + lVar1 + 8);
    }
    lVar2 = *plVar4;
    if (((ulong)(task->dec).flags & 0xc) == 0) {
      MVar3 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x48),0x10,(void *)0x0);
      if (MVar3 != MPP_OK) {
        _mpp_log_l(2,"hal_av1d_vdpu","poll cmd failed %d\n","vdpu_av1d_wait",(ulong)(uint)MVar3);
      }
    }
    if (*(long *)((long)hal + 0x40) != 0) {
      pvVar5 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar1 + 0x38),"vdpu_av1d_wait");
      mpp_buffer_sync_begin_f(*(MppBuffer *)(lVar1 + 0x38),1,"vdpu_av1d_wait");
      local_48 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar1 + 0x38),"vdpu_av1d_wait");
      local_38 = (uint)((*(uint *)(lVar2 + 4) >> 0xc & 1) == 0);
      local_40 = pvVar5;
      mpp_callback_f("vdpu_av1d_wait",*(MppCbCtx **)((long)hal + 0x40),&local_48);
    }
    if (*(int *)((long)hal + 0x58) != 0) {
      *(undefined4 *)(lVar1 + (long)(task->dec).reg_index * 0x10) = 0;
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu_av1d_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;

    INP_CHECK(ret, NULL == p_hal);
    VdpuAv1dRegCtx *reg_ctx = (VdpuAv1dRegCtx *)p_hal->reg_ctx;
    VdpuAv1dRegSet *p_regs = p_hal->fast_mode ?
                             reg_ctx->reg_buf[task->dec.reg_index].regs :
                             reg_ctx->regs;

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err) {
        goto __SKIP_HARD;
    }

    ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);
#if DUMP_AV1_DATAS
    {
        char fname[128];
        FILE *fp_in = NULL;
        static RK_U32 g_frame_no = 0;
        RK_U32 *p = (RK_U32*)p_regs;
        RK_U32 i;

        sprintf(fname, "/data/video/reg_%d_out.txt", g_frame_no++);
        fp_in = fopen(fname, "wb");
        for (i = 0; i < sizeof(*p_regs) / 4; i++, p++)
            fprintf(fp_in, "reg[%3d] = %08x\n", i, *p);

        fflush(fp_in);
        fclose(fp_in);
    }
#endif

__SKIP_HARD:
    if (p_hal->dec_cb) {
        DecCbHalDone m_ctx;
        RK_U32 *prob_out = (RK_U32*)mpp_buffer_get_ptr(reg_ctx->prob_tbl_out_base);

        mpp_buffer_sync_ro_begin(reg_ctx->prob_tbl_out_base);
        m_ctx.task = mpp_buffer_get_ptr(reg_ctx->prob_tbl_out_base);//(void *)&task->dec;
        m_ctx.regs = (RK_U32 *)prob_out;
        if (!p_regs->swreg1.sw_dec_rdy_int/* decode err */)
            m_ctx.hard_err = 1;
        else
            m_ctx.hard_err = 0;

        mpp_callback(p_hal->dec_cb, &m_ctx);
    }
    if (p_hal->fast_mode)
        reg_ctx->reg_buf[task->dec.reg_index].valid = 0;

    (void)task;
__RETURN:
    return ret = MPP_OK;
}